

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

int __thiscall ON_3dVector::IsParallelTo(ON_3dVector *this,ON_3dVector *v,double angle_tolerance)

{
  double z;
  double x;
  double y;
  double z_00;
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = this->x;
  dVar5 = this->y;
  z = this->z;
  dVar2 = ON_Length3d(dVar4,dVar5,z);
  x = v->x;
  y = v->y;
  z_00 = v->z;
  dVar3 = ON_Length3d(x,y,z_00);
  iVar1 = 0;
  if (0.0 < dVar3 * dVar2) {
    dVar5 = (z * z_00 + dVar4 * x + dVar5 * y) / (dVar3 * dVar2);
    dVar4 = cos(angle_tolerance);
    iVar1 = 1;
    if ((dVar5 < dVar4) && (iVar1 = 0, dVar5 <= -dVar4)) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int ON_3dVector::IsParallelTo( 
      // returns  1: this and other vectors are and parallel
      //         -1: this and other vectors are anti-parallel
      //          0: this and other vectors are not parallel
      //             or at least one of the vectors is zero
      const ON_3dVector& v,
      double angle_tolerance // (default=ON_DEFAULT_ANGLE_TOLERANCE) radians
      ) const
{
  int rc = 0;
  const double ll = Length()*v.Length();
  if ( ll > 0.0 ) {
    const double cos_angle = (x*v.x + y*v.y + z*v.z)/ll;
    const double cos_tol = cos(angle_tolerance);
    if ( cos_angle >= cos_tol )
      rc = 1;
    else if ( cos_angle <= -cos_tol )
      rc = -1;
  }
  return rc;
}